

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_write_indent(yaml_emitter_t *emitter)

{
  yaml_char_t *pyVar1;
  int iVar2;
  int local_20;
  int indent;
  yaml_emitter_t *emitter_local;
  
  if (emitter->indent < 0) {
    local_20 = 0;
  }
  else {
    local_20 = emitter->indent;
  }
  if (((emitter->indention == 0) || (local_20 < emitter->column)) ||
     ((emitter->column == local_20 && (emitter->whitespace == 0)))) {
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar2 = yaml_emitter_flush(emitter), iVar2 == 0)) {
      return 0;
    }
    if (emitter->line_break == YAML_CR_BREAK) {
      pyVar1 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar1 + 1;
      *pyVar1 = '\r';
    }
    else if (emitter->line_break == YAML_LN_BREAK) {
      pyVar1 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar1 + 1;
      *pyVar1 = '\n';
    }
    else if (emitter->line_break == YAML_CRLN_BREAK) {
      pyVar1 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar1 + 1;
      *pyVar1 = '\r';
      pyVar1 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar1 + 1;
      *pyVar1 = '\n';
    }
    emitter->column = 0;
    emitter->line = emitter->line + 1;
  }
  while( true ) {
    if (local_20 <= emitter->column) {
      emitter->whitespace = 1;
      emitter->indention = 1;
      return 1;
    }
    if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
       (iVar2 = yaml_emitter_flush(emitter), iVar2 == 0)) break;
    pyVar1 = (emitter->buffer).pointer;
    (emitter->buffer).pointer = pyVar1 + 1;
    *pyVar1 = ' ';
    emitter->column = emitter->column + 1;
  }
  return 0;
}

Assistant:

static int
yaml_emitter_write_indent(yaml_emitter_t *emitter)
{
    int indent = (emitter->indent >= 0) ? emitter->indent : 0;

    if (!emitter->indention || emitter->column > indent
            || (emitter->column == indent && !emitter->whitespace)) {
        if (!PUT_BREAK(emitter)) return 0;
    }

    while (emitter->column < indent) {
        if (!PUT(emitter, ' ')) return 0;
    }

    emitter->whitespace = 1;
    emitter->indention = 1;

    return 1;
}